

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  undefined1 this_00 [8];
  bool bVar2;
  Index bytes;
  int iVar3;
  uint uVar4;
  int32_t iVar5;
  Address AVar6;
  Literal *pLVar7;
  undefined4 extraout_var;
  int64_t iVar8;
  undefined1 local_2f8 [8];
  array<wasm::Literal,_16UL> lanes;
  Flow ptrFlow;
  Flow vecFlow;
  Literal local_d0;
  Literal local_b8;
  Literal local_a0;
  Literal local_88;
  undefined1 local_70 [8];
  Literal vec;
  undefined1 local_40 [8];
  MemoryInstanceInfo info;
  
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)&lanes._M_elems[0xf].type,&this->super_ExpressionRunner<wasm::ModuleRunner>,
             curr->ptr);
  if (ptrFlow.breakTo.super_IString.str._M_len == 0) {
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&ptrFlow.breakTo.super_IString.str._M_str,
               &this->super_ExpressionRunner<wasm::ModuleRunner>,curr->vec);
    if (vecFlow.breakTo.super_IString.str._M_len == 0) {
      getMemoryInstanceInfo
                ((MemoryInstanceInfo *)local_40,this,(Name)(curr->memory).super_IString.str);
      memory.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
      memory.super_IString.str._M_len = (size_t)info.instance;
      AVar6 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_40,memory);
      this_00 = local_40;
      pLVar7 = Flow::getSingleValue((Flow *)&lanes._M_elems[0xf].type);
      Literal::Literal((Literal *)&vecFlow.breakTo.super_IString.str._M_str,pLVar7);
      bytes = SIMDLoadStoreLane::getMemBytes(curr);
      AVar6 = getFinalAddress<wasm::SIMDLoadStoreLane>
                        ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,curr,
                         (Literal *)&vecFlow.breakTo.super_IString.str._M_str,bytes,AVar6);
      Literal::~Literal((Literal *)&vecFlow.breakTo.super_IString.str._M_str);
      pLVar7 = Flow::getSingleValue((Flow *)&ptrFlow.breakTo.super_IString.str._M_str);
      Literal::Literal((Literal *)local_70,pLVar7);
      switch(curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128:
        Literal::getLanesUI8x16((LaneArray<16> *)local_2f8,(Literal *)local_70);
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_40 + 0x200))->_vptr_ExternalInterface[0xe])
                            (*(ExternalInterface **)((long)local_40 + 0x200),AVar6.addr,
                             info.instance,info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(vec.type.id._4_4_,iVar3) & 0xffffffff000000ff;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&vec.type);
          Literal::~Literal((Literal *)&vec.type);
          Literal::Literal(&local_d0,(LaneArray<16> *)local_2f8);
          Flow::Flow(__return_storage_ptr__,&local_d0);
          Literal::~Literal(&local_d0);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_40 + 0x200);
          iVar5 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,AVar6.addr,(ulong)(uint)(int)(char)iVar5,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_2f8);
        break;
      case Load16LaneVec128:
      case Store16LaneVec128:
        Literal::getLanesUI16x8((LaneArray<8> *)local_2f8,(Literal *)local_70);
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_40 + 0x200))->_vptr_ExternalInterface[0x10]
                  )(*(ExternalInterface **)((long)local_40 + 0x200),AVar6.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(vec.type.id._4_4_,iVar3) & 0xffffffff0000ffff;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&vec.type);
          Literal::~Literal((Literal *)&vec.type);
          Literal::Literal(&local_b8,(LaneArray<8> *)local_2f8);
          Flow::Flow(__return_storage_ptr__,&local_b8);
          Literal::~Literal(&local_b8);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_40 + 0x200);
          iVar5 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x17])
                    (pEVar1,AVar6.addr,(ulong)(uint)(int)(short)iVar5,info.instance,
                     info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_2f8);
        break;
      case Load32LaneVec128:
      case Store32LaneVec128:
        Literal::getLanesI32x4((LaneArray<4> *)local_2f8,(Literal *)local_70);
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_40 + 0x200))->_vptr_ExternalInterface[0x12]
                  )(*(ExternalInterface **)((long)local_40 + 0x200),AVar6.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id._0_4_ = iVar3;
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&vec.type);
          Literal::~Literal((Literal *)&vec.type);
          Literal::Literal(&local_a0,(LaneArray<4> *)local_2f8);
          Flow::Flow(__return_storage_ptr__,&local_a0);
          Literal::~Literal(&local_a0);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_40 + 0x200);
          uVar4 = Literal::geti32((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x18])
                    (pEVar1,AVar6.addr,(ulong)uVar4,info.instance,info.name.super_IString.str._M_len
                    );
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_2f8);
        break;
      case Load64LaneVec128:
      case Store64LaneVec128:
        Literal::getLanesI64x2((LaneArray<2> *)local_2f8,(Literal *)local_70);
        bVar2 = SIMDLoadStoreLane::isLoad(curr);
        if (bVar2) {
          iVar3 = (*(*(ExternalInterface **)((long)local_40 + 0x200))->_vptr_ExternalInterface[0x14]
                  )(*(ExternalInterface **)((long)local_40 + 0x200),AVar6.addr,info.instance,
                    info.name.super_IString.str._M_len);
          vec.type.id = CONCAT44(extraout_var,iVar3);
          Literal::operator=((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type,
                             (Literal *)&vec.type);
          Literal::~Literal((Literal *)&vec.type);
          Literal::Literal(&local_88,(LaneArray<2> *)local_2f8);
          Flow::Flow(__return_storage_ptr__,&local_88);
          Literal::~Literal(&local_88);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_40 + 0x200);
          iVar8 = Literal::geti64((Literal *)&lanes._M_elems[(ulong)curr->index - 1].type);
          (*pEVar1->_vptr_ExternalInterface[0x19])
                    (pEVar1,AVar6.addr,iVar8,info.instance,info.name.super_IString.str._M_len);
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_len = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
          super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.func.super_IString.str._M_str = (char *)0x0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          type.id = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
          (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].
          field_0.i64 = 0;
          (__return_storage_ptr__->breakTo).super_IString.str._M_str = (char *)0x0;
        }
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_2f8);
        break;
      default:
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0xf91);
      }
      Literal::~Literal((Literal *)local_70);
    }
    else {
      Flow::Flow(__return_storage_ptr__,(Flow *)&ptrFlow.breakTo.super_IString.str._M_str);
    }
    SmallVector<wasm::Literal,_1UL>::~SmallVector
              ((SmallVector<wasm::Literal,_1UL> *)&ptrFlow.breakTo.super_IString.str._M_str);
  }
  else {
    Flow::Flow(__return_storage_ptr__,(Flow *)&lanes._M_elems[0xf].type);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector
            ((SmallVector<wasm::Literal,_1UL> *)&lanes._M_elems[0xf].type);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow ptrFlow = self()->visit(curr->ptr);
    if (ptrFlow.breaking()) {
      return ptrFlow;
    }
    NOTE_EVAL1(ptrFlow);
    Flow vecFlow = self()->visit(curr->vec);
    if (vecFlow.breaking()) {
      return vecFlow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, ptrFlow.getSingleValue(), curr->getMemBytes(), memorySize);
    Literal vec = vecFlow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.interface()->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.interface()->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }